

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_3c2cdc::UnpackAttributeEntryOp::operator()(UnpackAttributeEntryOp *this,Entry *e)

{
  cali_entry_proc_fn p_Var1;
  void *pvVar2;
  bool bVar3;
  int iVar4;
  cali_id_t cVar5;
  cali_variant_t local_68;
  cali_variant_t local_58;
  Node *local_48;
  Node *node;
  cali_variant_t local_30;
  Entry *local_20;
  Entry *e_local;
  UnpackAttributeEntryOp *this_local;
  
  local_20 = e;
  e_local = (Entry *)this;
  bVar3 = cali::Entry::is_immediate(e);
  if ((bVar3) && (cVar5 = cali::Entry::attribute(local_20), cVar5 == this->m_id)) {
    p_Var1 = this->m_fn;
    pvVar2 = this->m_arg;
    cVar5 = cali::Entry::attribute(local_20);
    _node = (cali_variant_t)cali::Entry::value(local_20);
    local_30 = cali::Variant::c_variant((Variant *)&node);
    iVar4 = (*p_Var1)(pvVar2,cVar5,local_30);
    if (iVar4 == 0) {
      return false;
    }
  }
  else {
    local_48 = cali::Entry::node(local_20);
    while( true ) {
      bVar3 = false;
      if (local_48 != (Node *)0x0) {
        cVar5 = cali::Node::id(local_48);
        bVar3 = cVar5 != 0xffffffffffffffff;
      }
      if (!bVar3) break;
      cVar5 = cali::Node::attribute(local_48);
      if (cVar5 == this->m_id) {
        p_Var1 = this->m_fn;
        pvVar2 = this->m_arg;
        cVar5 = cali::Node::attribute(local_48);
        local_68 = (cali_variant_t)cali::Node::data(local_48);
        local_58 = cali::Variant::c_variant((Variant *)&local_68);
        iVar4 = (*p_Var1)(pvVar2,cVar5,local_58);
        if (iVar4 == 0) {
          return false;
        }
      }
      local_48 = cali::util::LockfreeIntrusiveTree<cali::Node>::parent
                           (&local_48->super_LockfreeIntrusiveTree<cali::Node>);
    }
  }
  return true;
}

Assistant:

inline bool operator() (const Entry& e)
    {
        if (e.is_immediate() && e.attribute() == m_id) {
            if ((*m_fn)(m_arg, e.attribute(), e.value().c_variant()) == 0)
                return false;
        } else {
            for (const Node* node = e.node(); node && node->id() != CALI_INV_ID; node = node->parent())
                if (node->attribute() == m_id)
                    if ((*m_fn)(m_arg, node->attribute(), node->data().c_variant()) == 0)
                        return false;
        }

        return true;
    }